

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmExhaustiveRgb.cpp
# Opt level: O1

void __thiscall AlgorithmExhaustiveRgb::Iterate(AlgorithmExhaustiveRgb *this)

{
  qulonglong *pqVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  QRgb QVar8;
  QRgb a;
  QRgb QVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  OnExit exigGuard;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AlgorithmExhaustiveRgb.cpp:34:29)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/SebastianTroy[P]allRGB/AlgorithmExhaustiveRgb.cpp:34:29)>
             ::_M_manager;
  iVar14 = (int)this + 0x28;
  iVar15 = (int)this + 0x10;
  iVar5 = 0;
  local_58._M_unused._M_object = this;
  do {
    iVar2 = this->outerX;
    iVar7 = QImage::width();
    if (iVar7 <= iVar2) {
      this->outerX = 0;
LAB_0010cb37:
      Iterate::OnExit::~OnExit((OnExit *)&local_58);
      return;
    }
    while (iVar2 = this->outerY, iVar7 = QImage::height(), iVar2 < iVar7) {
      while (iVar2 = this->innerX, iVar7 = QImage::width(), iVar2 < iVar7) {
        while (iVar2 = this->innerY, iVar7 = QImage::height(), iVar2 < iVar7) {
          iVar2 = this->outerX;
          uVar3 = this->outerY;
          iVar7 = this->innerX;
          uVar4 = this->innerY;
          QVar8 = QImage::pixel(iVar14,iVar2);
          a = QImage::pixel(iVar14,iVar7);
          QVar9 = QImage::pixel(iVar15,iVar2);
          iVar10 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar8,QVar9);
          QVar9 = QImage::pixel(iVar15,iVar7);
          iVar11 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar9);
          QVar9 = QImage::pixel(iVar15,iVar7);
          iVar12 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar8,QVar9);
          QVar8 = QImage::pixel(iVar15,iVar2);
          iVar13 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar8);
          if (iVar13 + iVar12 < iVar11 + iVar10) {
            QImage::setPixel(iVar14,iVar2,uVar3);
            QImage::setPixel(iVar14,iVar7,uVar4);
            pqVar1 = &(this->super_AlgorithmBase).improvements_;
            *pqVar1 = *pqVar1 + 1;
            cVar6 = '\x0e';
          }
          else {
            cVar6 = 99999 < iVar5;
            iVar5 = iVar5 + 1;
          }
          if (cVar6 != '\0') {
            if (cVar6 != '\x0e') goto LAB_0010cb37;
            goto LAB_0010cafe;
          }
          this->innerY = this->innerY + 1;
        }
        this->innerY = 0;
        this->innerX = this->innerX + 1;
      }
      this->innerX = 0;
LAB_0010cafe:
      this->outerY = this->outerY + 1;
    }
    this->outerY = 0;
    this->outerX = this->outerX + 1;
  } while( true );
}

Assistant:

void AlgorithmExhaustiveRgb::Iterate()
{
    struct OnExit {
        std::function<void()> onExit;
        ~OnExit()
        {
            onExit();
        }
    };

    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;

    auto exigGuard = OnExit{[&]()
    {
        iterations_ += repeats;

        emit onIterationsChanged(iterations_);
        emit onImprovementsChanged(improvements_);
    }};

    int repeat = 0;

    for (; outerX < allRgb_.width(); ++outerX) {
        for (; outerY < allRgb_.height(); ++outerY) {
            for (; innerX < allRgb_.width(); ++innerX) {
                for (; innerY < allRgb_.height(); ++innerY) {
                    QPoint aLoc{ outerX, outerY };
                    QPoint bLoc{ innerX, innerY };
                    QRgb a = allRgb_.pixel(aLoc);
                    QRgb b = allRgb_.pixel(bLoc);

                    int aDifference = ColourDifference(a, target_.pixel(aLoc));
                    int bDifference = ColourDifference(b, target_.pixel(bLoc));

                    int aSwappedDifference = ColourDifference(a, target_.pixel(bLoc));
                    int bSwappedDifference = ColourDifference(b, target_.pixel(aLoc));

                    if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
                        allRgb_.setPixel(aLoc, b);
                        allRgb_.setPixel(bLoc, a);
                        ++improvements_;
                        goto next;
                    }

                    if (++repeat > repeats) {
                        return;
                    }
                }
                innerY = 0;
            }
            innerX = 0;
next:;
        }
        outerY = 0;
    }
    outerX = 0;
}